

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O3

void __thiscall
wasm::DeadCodeElimination::visitExpression(DeadCodeElimination *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Id IVar1;
  Module *curr_00;
  byte bVar2;
  DeadCodeElimination *this_01;
  Index IVar3;
  Index IVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  TypeUpdater *this_02;
  Drop *this_03;
  Block *expression;
  Expression ***pppEVar7;
  ulong uVar8;
  uint uVar9;
  ulong size;
  long lVar10;
  Expression *expression_00;
  int iVar11;
  Index IVar12;
  bool bVar13;
  bool bVar14;
  AbstractChildIterator<wasm::ChildIterator> local_c0;
  Builder local_80;
  Builder builder;
  Expression *child;
  Module *local_68;
  DeadCodeElimination *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> remainingChildren;
  
  IVar1 = curr->_id;
  if ((int)IVar1 < 3) {
    if (IVar1 == BlockId) {
      this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(curr + 2);
      uVar5 = curr[2].type.id;
      if (uVar5 != 0) {
        uVar8 = 0;
        size = 1;
LAB_006c8c4b:
        uVar9 = (uint)size;
        if ((this_00->data[uVar8]->type).id != 1) goto code_r0x006c8c5a;
        if (uVar9 != 0) {
          if (size < uVar5) {
            uVar5 = size;
            do {
              uVar9 = uVar9 + 1;
              TypeUpdater::noteRecursiveRemoval
                        (&this->typeUpdater,*(Expression **)(*(long *)(curr + 2) + uVar5 * 8));
              uVar5 = (ulong)uVar9;
            } while (uVar5 < curr[2].type.id);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize(this_00,size)
          ;
          uVar5 = curr[2].type.id;
          if (uVar5 != 1) goto LAB_006c8d6e;
          expression_00 = *this_00->data;
          if (expression_00->_id == UnreachableId) goto LAB_006c8c76;
          if ((curr->type).id < 2) {
            return;
          }
          uVar5 = 1;
          goto LAB_006c8d88;
        }
        goto LAB_006c8d6e;
      }
      uVar5 = 0;
LAB_006c8d6e:
      if ((curr->type).id < 2) {
        return;
      }
      if (uVar5 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
LAB_006c8d88:
      if ((this_00->data[uVar5 - 1]->type).id != 1) {
        return;
      }
      if (curr[1].type.id != 0) {
        pmVar6 = std::
                 map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
                 ::operator[](&(this->typeUpdater).blockInfos,(key_type *)(curr + 1));
        if (0 < pmVar6->numBreaks) {
          return;
        }
        if ((curr->type).id == 1) {
          return;
        }
      }
    }
    else {
      if (IVar1 != IfId) {
LAB_006c8b91:
        if ((curr->type).id == 1) {
          local_60 = this;
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_c0,curr);
          iVar11 = (int)((ulong)((long)local_c0.children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c0.children.flexible.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                   (int)local_c0.children.usedFixed;
          if (iVar11 == 0) {
            bVar13 = true;
          }
          else {
            IVar12 = 0;
            do {
              IVar3 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_c0,IVar12);
              pppEVar7 = local_c0.children.flexible.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
              if (IVar3 < 4) {
                pppEVar7 = local_c0.children.fixed._M_elems + IVar3;
              }
              bVar13 = ((**pppEVar7)->type).id != 1;
            } while ((bVar13) && (bVar14 = iVar11 - 1U != IVar12, IVar12 = IVar12 + 1, bVar14));
          }
          if (local_c0.children.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_c0.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_c0.children.flexible.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar13) {
            local_80.wasm =
                 (local_60->
                 super_WalkerPass<wasm::PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>_>
                 ).
                 super_PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                 .
                 super_Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                 .currModule;
            auStack_58 = (undefined1  [8])0x0;
            remainingChildren.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            remainingChildren.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_68 = local_80.wasm;
            AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_c0,curr);
            IVar12 = (int)((ulong)((long)local_c0.children.flexible.
                                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_c0.children.flexible.
                                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                     (int)local_c0.children.usedFixed;
            if (IVar12 != 0) {
              this_02 = &local_60->typeUpdater;
              local_68 = (Module *)&local_68->allocator;
              bVar13 = false;
              IVar3 = 0;
              do {
                IVar4 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_c0,IVar3);
                pppEVar7 = local_c0.children.flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_start + ((ulong)IVar4 - 4);
                if (IVar4 < 4) {
                  pppEVar7 = local_c0.children.fixed._M_elems + IVar4;
                }
                curr_00 = (Module *)**pppEVar7;
                builder.wasm = curr_00;
                if (bVar13) {
                  bVar13 = true;
                  TypeUpdater::noteRecursiveRemoval(this_02,(Expression *)curr_00);
                }
                else if (((Type *)&(curr_00->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->id == 1) {
                  if (remainingChildren.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      remainingChildren.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    bVar13 = true;
                    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                    _M_realloc_insert<wasm::Expression*const&>
                              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                               auStack_58,
                               (iterator)
                               remainingChildren.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,(Expression **)&builder);
                  }
                  else {
                    *remainingChildren.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start = (Expression *)curr_00;
                    remainingChildren.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         remainingChildren.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1;
                    bVar13 = true;
                  }
                }
                else {
                  this_03 = (Drop *)MixedArena::allocSpace((MixedArena *)local_68,0x18,8);
                  (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id
                       = DropId;
                  (this_03->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.
                  type.id = 0;
                  this_03->value = (Expression *)curr_00;
                  Drop::finalize(this_03);
                  child = (Expression *)this_03;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_58,&child);
                  bVar13 = false;
                }
                IVar3 = IVar3 + 1;
              } while (IVar12 != IVar3);
            }
            if (local_c0.children.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_c0.children.flexible.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c0.children.flexible.
                                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            this_01 = local_60;
            if ((long)remainingChildren.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 == 8) {
              expression = *(Block **)auStack_58;
            }
            else {
              expression = Builder::
                           makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                     (&local_80,
                                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)auStack_58);
            }
            replaceCurrent(this_01,(Expression *)expression);
            if (auStack_58 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_58,
                              (long)remainingChildren.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
            }
          }
        }
        return;
      }
      if (*(long *)(*(long *)(curr + 1) + 8) == 1) {
        TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,(Expression *)curr[1].type.id);
        if (*(Expression **)(curr + 2) != (Expression *)0x0) {
          TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*(Expression **)(curr + 2));
        }
        expression_00 = *(Expression **)(curr + 1);
        goto LAB_006c8c76;
      }
      if ((curr->type).id == 1) {
        return;
      }
      if (*(long *)(curr + 2) == 0) {
        return;
      }
      if (*(long *)(curr[1].type.id + 8) != 1) {
        return;
      }
      if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
        return;
      }
    }
  }
  else {
    if (IVar1 == LoopId) {
      expression_00 = *(Expression **)(curr + 2);
      if (expression_00->_id != UnreachableId) {
        return;
      }
LAB_006c8c76:
      replaceCurrent(this,expression_00);
      return;
    }
    if (IVar1 != TryId) goto LAB_006c8b91;
    if (*(long *)(curr + 5) == 0) {
      bVar2 = 1;
    }
    else {
      bVar2 = 1;
      lVar10 = 0;
      do {
        bVar2 = bVar2 & *(long *)(*(long *)(curr[4].type.id + lVar10 * 8) + 8) == 1;
        lVar10 = lVar10 + 1;
      } while (*(long *)(curr + 5) != lVar10);
    }
    if ((curr->type).id == 1) {
      return;
    }
    if (!(bool)(*(long *)(*(long *)(curr + 2) + 8) == 1 & bVar2)) {
      return;
    }
  }
  (curr->type).id = 1;
  TypeUpdater::propagateTypesUp(&this->typeUpdater,curr);
  return;
code_r0x006c8c5a:
  bVar13 = uVar5 <= size;
  uVar8 = size;
  size = (ulong)(uVar9 + 1);
  if (bVar13) goto LAB_006c8d6e;
  goto LAB_006c8c4b;
}

Assistant:

void visitExpression(Expression* curr) {
    if (!Properties::isControlFlowStructure(curr)) {
      // Control flow structures require special handling, but others are
      // simple.
      if (curr->type == Type::unreachable) {
        // This may be dead code. Check if there is an unreachable child.
        bool hasUnreachableChild = false;
        for (auto* child : ChildIterator(curr)) {
          if (child->type == Type::unreachable) {
            hasUnreachableChild = true;
            break;
          }
        }
        if (hasUnreachableChild) {
          // This is indeed unreachable code, made unreachable by that child.
          Builder builder(*getModule());
          std::vector<Expression*> remainingChildren;
          bool afterUnreachable = false;
          for (auto* child : ChildIterator(curr)) {
            if (afterUnreachable) {
              typeUpdater.noteRecursiveRemoval(child);
              continue;
            }
            if (child->type == Type::unreachable) {
              remainingChildren.push_back(child);
              afterUnreachable = true;
            } else {
              remainingChildren.push_back(builder.makeDrop(child));
            }
          }
          if (remainingChildren.size() == 1) {
            replaceCurrent(remainingChildren[0]);
          } else {
            replaceCurrent(builder.makeBlock(remainingChildren));
          }
        }
      }
      return;
    }
    // This is a control flow structure.
    if (auto* block = curr->dynCast<Block>()) {
      auto& list = block->list;
      // The index from which to remove, which is one after the first
      // unreachable instruction. Note that 0 is not a valid value, so we can
      // use it as such.
      Index removeFromHere = 0;
      for (Index i = 0; i < list.size(); i++) {
        if (list[i]->type == Type::unreachable) {
          removeFromHere = i + 1;
          break;
        }
      }
      if (removeFromHere != 0) {
        for (Index i = removeFromHere; i < list.size(); i++) {
          typeUpdater.noteRecursiveRemoval(list[i]);
        }
        list.resize(removeFromHere);
        if (list.size() == 1 && list[0]->is<Unreachable>()) {
          replaceCurrent(list[0]);
          return;
        }
      }
      // Finally, if there is no need for a concrete type (which is when there
      // is one marked, but nothing breaks to it, and also the block does not
      // have a concrete value flowing out) then remove it, which may allow
      // more reduction.
      if (block->type.isConcrete() && list.back()->type == Type::unreachable &&
          !typeUpdater.hasBreaks(block)) {
        typeUpdater.changeType(block, Type::unreachable);
      }
    } else if (auto* iff = curr->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        typeUpdater.noteRecursiveRemoval(iff->ifTrue);
        if (iff->ifFalse) {
          typeUpdater.noteRecursiveRemoval(iff->ifFalse);
        }
        replaceCurrent(iff->condition);
        return;
      }
      // If both arms are unreachable, there is no need for a concrete type,
      // which may allow more reduction.
      if (iff->type != Type::unreachable && iff->ifFalse &&
          iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type == Type::unreachable) {
        typeUpdater.changeType(iff, Type::unreachable);
      }
    } else if (auto* loop = curr->dynCast<Loop>()) {
      // The loop body may have unreachable type if it branches back to the
      // loop top, for example. The only case we look for here is where we've
      // already removed the entire body as dead code.
      if (loop->body->is<Unreachable>()) {
        replaceCurrent(loop->body);
      }
    } else if (auto* tryy = curr->dynCast<Try>()) {
      // If both try body and catch body are unreachable, there is no need for a
      // concrete type, which may allow more reduction.
      bool allCatchesUnreachable = true;
      for (auto* catchBody : tryy->catchBodies) {
        allCatchesUnreachable &= catchBody->type == Type::unreachable;
      }
      if (tryy->type != Type::unreachable &&
          tryy->body->type == Type::unreachable && allCatchesUnreachable) {
        typeUpdater.changeType(tryy, Type::unreachable);
      }
    } else {
      WASM_UNREACHABLE("unimplemented DCE control flow structure");
    }
  }